

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void __thiscall
Assimp::glTFExporter::glTFExporter
          (glTFExporter *this,char *filename,IOSystem *pIOSystem,aiScene *pScene,
          ExportProperties *pProperties,bool isBinary)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<glTF::Asset> *this_00;
  element_type *peVar2;
  aiNode *n;
  Asset *this_01;
  Ref<glTF::Buffer> RVar3;
  aiScene *sceneCopy_tmp;
  SplitLargeMeshesProcess_Vertex vert_splitter;
  SplitLargeMeshesProcess_Triangle tri_splitter;
  AssetWriter writer;
  aiScene *local_e0;
  SplitLargeMeshesProcess_Vertex local_d8;
  SplitLargeMeshesProcess_Triangle local_b8;
  AssetWriter local_98;
  
  this->mFilename = filename;
  this->mIOSystem = pIOSystem;
  this->mProperties = pProperties;
  p_Var1 = &(this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mTexturesByPath)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBodyData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SceneCombiner::CopyScene(&local_e0,pScene,true);
  SplitLargeMeshesProcess_Triangle::SplitLargeMeshesProcess_Triangle(&local_b8);
  local_b8.LIMIT = 0xffff;
  SplitLargeMeshesProcess_Triangle::Execute(&local_b8,local_e0);
  SplitLargeMeshesProcess_Vertex::SplitLargeMeshesProcess_Vertex(&local_d8);
  local_d8.LIMIT = 0xffff;
  SplitLargeMeshesProcess_Vertex::Execute(&local_d8,local_e0);
  this->mScene = local_e0;
  this_01 = (Asset *)operator_new(0x778);
  glTF::Asset::Asset(this_01,pIOSystem);
  this_00 = &this->mAsset;
  std::__shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>::reset<glTF::Asset>
            (&this_00->super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>,this_01);
  if ((isBinary) &&
     (peVar2 = (this_00->super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     (peVar2->extensionsUsed).KHR_binary_glTF == false)) {
    (peVar2->extensionsUsed).KHR_binary_glTF = true;
    RVar3 = glTF::LazyDict<glTF::Buffer>::Create(&peVar2->buffers,"binary_glTF");
    (peVar2->mBodyBuffer).vector = RVar3.vector;
    (peVar2->mBodyBuffer).index = RVar3.index;
    ((RVar3.vector)->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[RVar3.index]->mIsSpecial = true;
  }
  ExportMetadata(this);
  ExportMaterials(this);
  n = this->mScene->mRootNode;
  if (n != (aiNode *)0x0) {
    ExportNodeHierarchy(this,n);
  }
  ExportMeshes(this);
  ExportScene(this);
  ExportAnimations(this);
  glTF::AssetWriter::AssetWriter
            (&local_98,(this_00->super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  if (isBinary) {
    glTF::AssetWriter::WriteGLBFile(&local_98,filename);
  }
  else {
    glTF::AssetWriter::WriteFile(&local_98,filename);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_98.mDoc);
  SplitLargeMeshesProcess_Vertex::~SplitLargeMeshesProcess_Vertex(&local_d8);
  SplitLargeMeshesProcess_Triangle::~SplitLargeMeshesProcess_Triangle(&local_b8);
  return;
}

Assistant:

glTFExporter::glTFExporter(const char* filename, IOSystem* pIOSystem, const aiScene* pScene,
                           const ExportProperties* pProperties, bool isBinary)
    : mFilename(filename)
    , mIOSystem(pIOSystem)
    , mProperties(pProperties)
{
    aiScene* sceneCopy_tmp;
    SceneCombiner::CopyScene(&sceneCopy_tmp, pScene);
    aiScene *sceneCopy(sceneCopy_tmp);

    SplitLargeMeshesProcess_Triangle tri_splitter;
    tri_splitter.SetLimit(0xffff);
    tri_splitter.Execute(sceneCopy);

    SplitLargeMeshesProcess_Vertex vert_splitter;
    vert_splitter.SetLimit(0xffff);
    vert_splitter.Execute(sceneCopy);

    mScene = sceneCopy;

    mAsset.reset( new glTF::Asset( pIOSystem ) );

    if (isBinary) {
        mAsset->SetAsBinary();
    }

    ExportMetadata();

    //for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {}

    //for (unsigned int i = 0; i < pScene->mNumLights; ++i) {}

    ExportMaterials();

    if (mScene->mRootNode) {
        ExportNodeHierarchy(mScene->mRootNode);
    }

    ExportMeshes();

    //for (unsigned int i = 0; i < pScene->mNumTextures; ++i) {}

    ExportScene();

    ExportAnimations();

    glTF::AssetWriter writer(*mAsset);

    if (isBinary) {
        writer.WriteGLBFile(filename);
    } else {
        writer.WriteFile(filename);
    }
}